

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_13daf71::TransformSelectorFor::Validate(TransformSelectorFor *this,size_t count)

{
  pointer piVar1;
  pointer piVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  runtime_error *this_00;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  int iVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  int iVar14;
  undefined1 auVar13 [16];
  string sStack_98;
  cmAlphaNum local_78;
  cmAlphaNum local_48;
  
  iVar6 = TransformSelectorIndexes::NormalizeIndex
                    (&this->super_TransformSelectorIndexes,this->Start,count);
  this->Start = iVar6;
  iVar6 = TransformSelectorIndexes::NormalizeIndex
                    (&this->super_TransformSelectorIndexes,this->Stop,count);
  this->Stop = iVar6;
  if (iVar6 < this->Start) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_78.View_._M_len = 0x52;
    local_78.View_._M_str =
         "sub-command TRANSFORM, selector FOR expects <start> to be no greater than <stop> (";
    cmAlphaNum::cmAlphaNum(&local_48,this->Start);
    cmStrCat<char[4],int,char[2]>
              (&sStack_98,&local_78,&local_48,(char (*) [4])" > ",&this->Stop,(char (*) [2])0x791958
              );
    std::runtime_error::runtime_error(this_00,(string *)&sStack_98);
    *(undefined ***)this_00 = &PTR__runtime_error_00950630;
    __cxa_throw(this_00,&(anonymous_namespace)::transform_error::typeinfo,
                std::runtime_error::~runtime_error);
  }
  iVar6 = (iVar6 - this->Start) + 1;
  std::vector<int,_std::allocator<int>_>::resize
            (&(this->super_TransformSelectorIndexes).Indexes,
             (long)(int)((iVar6 / this->Step + 1) - (uint)(iVar6 % this->Step == 0)));
  auVar5 = _DAT_0073b730;
  auVar4 = _DAT_0073b720;
  auVar3 = _DAT_0073b710;
  piVar1 = (this->super_TransformSelectorIndexes).Indexes.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  piVar2 = (this->super_TransformSelectorIndexes).Indexes.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  if (piVar1 != piVar2) {
    iVar6 = this->Step;
    iVar8 = this->Start;
    uVar7 = (long)piVar2 + (-4 - (long)piVar1);
    auVar13._8_4_ = (int)uVar7;
    auVar13._0_8_ = uVar7;
    auVar13._12_4_ = (int)(uVar7 >> 0x20);
    auVar10._0_8_ = uVar7 >> 2;
    auVar10._8_8_ = auVar13._8_8_ >> 2;
    uVar9 = 0;
    auVar10 = auVar10 ^ _DAT_0073b730;
    do {
      auVar12._8_4_ = (int)uVar9;
      auVar12._0_8_ = uVar9;
      auVar12._12_4_ = (int)(uVar9 >> 0x20);
      auVar13 = (auVar12 | auVar4) ^ auVar5;
      iVar11 = auVar10._4_4_;
      if ((bool)(~(auVar13._4_4_ == iVar11 && auVar10._0_4_ < auVar13._0_4_ ||
                  iVar11 < auVar13._4_4_) & 1)) {
        piVar1[uVar9] = iVar8;
      }
      if ((auVar13._12_4_ != auVar10._12_4_ || auVar13._8_4_ <= auVar10._8_4_) &&
          auVar13._12_4_ <= auVar10._12_4_) {
        piVar1[uVar9 + 1] = iVar6 + iVar8;
      }
      auVar13 = (auVar12 | auVar3) ^ auVar5;
      iVar14 = auVar13._4_4_;
      if (iVar14 <= iVar11 && (iVar14 != iVar11 || auVar13._0_4_ <= auVar10._0_4_)) {
        piVar1[uVar9 + 2] = iVar6 * 2 + iVar8;
        piVar1[uVar9 + 3] = iVar6 * 3 + iVar8;
      }
      uVar9 = uVar9 + 4;
      iVar8 = iVar8 + iVar6 * 4;
    } while (((uVar7 >> 2) + 4 & 0xfffffffffffffffc) != uVar9);
  }
  return true;
}

Assistant:

bool Validate(std::size_t count) override
  {
    this->Start = this->NormalizeIndex(this->Start, count);
    this->Stop = this->NormalizeIndex(this->Stop, count);

    // Does stepping move us further from the end?
    if (this->Start > this->Stop) {
      throw transform_error(
        cmStrCat("sub-command TRANSFORM, selector FOR "
                 "expects <start> to be no greater than <stop> (",
                 this->Start, " > ", this->Stop, ")"));
    }

    // compute indexes
    auto size = (this->Stop - this->Start + 1) / this->Step;
    if ((this->Stop - this->Start + 1) % this->Step != 0) {
      size += 1;
    }

    this->Indexes.resize(size);
    auto start = this->Start;
    auto step = this->Step;
    std::generate(this->Indexes.begin(), this->Indexes.end(),
                  [&start, step]() -> int {
                    auto r = start;
                    start += step;
                    return r;
                  });

    return true;
  }